

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_mul_62
               (secp256k1_modinv64_signed62 *r,secp256k1_modinv64_signed62 *a,int alen,
               int64_t factor)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  secp256k1_ge *extraout_RDX;
  long lVar7;
  long lVar8;
  secp256k1_ge *psVar9;
  secp256k1_ge *psVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  byte bVar17;
  
  bVar17 = 0;
  lVar15 = 0;
  lVar7 = 0;
  uVar13 = 0;
  do {
    if (lVar15 < alen) {
      uVar5 = factor * a->v[lVar15];
      uVar6 = SUB168(SEXT816(factor) * SEXT816(a->v[lVar15]),8);
      if ((long)uVar6 < 0) {
        lVar8 = (-0x8000000000000000 - uVar6) - (ulong)(uVar5 != 0);
        lVar1 = lVar7 - lVar8;
        if ((SBORROW8(lVar7,lVar8) != SBORROW8(lVar1,(ulong)(uVar13 < -uVar5))) ==
            (long)(lVar1 - (ulong)(uVar13 < -uVar5)) < 0) goto LAB_0011cccc;
      }
      else {
        lVar1 = (uVar6 ^ 0x7fffffffffffffff) - lVar7;
        if ((SBORROW8(uVar6 ^ 0x7fffffffffffffff,lVar7) != SBORROW8(lVar1,(ulong)(~uVar5 < uVar13)))
            == (long)(lVar1 - (ulong)(~uVar5 < uVar13)) < 0) {
LAB_0011cccc:
          bVar16 = CARRY8(uVar13,uVar5);
          uVar13 = uVar13 + uVar5;
          lVar7 = lVar7 + uVar6 + (ulong)bVar16;
          goto LAB_0011ccd2;
        }
      }
      secp256k1_modinv64_mul_62_cold_3();
      goto LAB_0011cd38;
    }
LAB_0011ccd2:
    uVar5 = lVar7 << 2 | uVar13 >> 0x3e;
    r->v[lVar15] = uVar13 & 0x3fffffffffffffff;
    lVar7 = lVar7 >> 0x3e;
    lVar15 = lVar15 + 1;
    uVar13 = uVar5;
  } while (lVar15 != 4);
  if (4 < alen) {
    uVar13 = factor * a->v[4];
    bVar16 = CARRY8(uVar5,uVar13);
    uVar5 = uVar5 + uVar13;
    lVar7 = lVar7 + SUB168(SEXT816(factor) * SEXT816(a->v[4]),8) + (ulong)bVar16;
  }
  if (lVar7 + -1 + (ulong)(0x7fffffffffffffff < uVar5) == -1) {
    if (lVar7 == (long)uVar5 >> 0x3f) {
      r->v[4] = uVar5;
      return;
    }
  }
  else {
LAB_0011cd38:
    secp256k1_modinv64_mul_62_cold_2();
  }
  secp256k1_modinv64_mul_62_cold_1();
  if ((secp256k1_ge *)r == extraout_RDX) {
    secp256k1_scalar_split_lambda_cold_3();
  }
  else if ((secp256k1_ge *)a != extraout_RDX) {
    if (r != a) {
      iVar3 = (int)(extraout_RDX->x).n[0];
      uVar4 = iVar3 + 5;
      iVar3 = (iVar3 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc)) + 5;
      *(int *)(((secp256k1_ge *)a)->x).n = iVar3;
      uVar4 = (0xd - iVar3) * 9 + (int)(extraout_RDX->x).n[0];
      *(uint *)(((secp256k1_ge *)r)->x).n = uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc);
      return;
    }
    goto LAB_0011cda0;
  }
  secp256k1_scalar_split_lambda_cold_2();
LAB_0011cda0:
  secp256k1_scalar_split_lambda_cold_1();
  uVar4 = (uint)a;
  uVar12 = ((uVar4 & 1) == (uint)(6 < uVar4)) + uVar4;
  if (uVar12 < 0xd) {
    uVar11 = 0xd - uVar12;
    if (uVar12 == 0) {
      uVar11 = uVar12;
    }
    lVar7 = 0;
    if (uVar4 < 7) {
      uVar11 = uVar12;
    }
    uVar12 = (uVar4 < 7) - 1 | 1;
    a = (secp256k1_modinv64_signed62 *)(ulong)uVar12;
    uVar4 = uVar11 & 7;
    do {
      uVar2 = uVar11;
      if (uVar4 == 0) {
        secp256k1_wnaf_const_cold_4();
LAB_0011ce47:
        secp256k1_wnaf_const_cold_3();
        goto LAB_0011ce4c;
      }
      if ((uVar4 & 1) == 0) goto LAB_0011ce47;
      uVar11 = uVar2 >> 3;
      uVar14 = (uVar11 ^ 1) + uVar11;
      *(uint *)((long)(((secp256k1_ge *)r)->x).n + lVar7 * 4) = (uVar4 + (uVar11 ^ 1) * -8) * uVar12
      ;
      lVar7 = lVar7 + 1;
      uVar4 = uVar14;
    } while (lVar7 != 0x2b);
    *(uint *)((long)(((secp256k1_ge *)((long)r + 0x68))->y).n + 0x14) = uVar14 * uVar12;
    if (uVar2 < 0x40) {
      return;
    }
  }
  else {
LAB_0011ce4c:
    secp256k1_wnaf_const_cold_1();
  }
  secp256k1_wnaf_const_cold_2();
  psVar9 = (secp256k1_ge *)a;
  psVar10 = (secp256k1_ge *)r;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    (psVar10->x).n[0] = (psVar9->x).n[0];
    psVar9 = (secp256k1_ge *)((long)psVar9 + (ulong)bVar17 * -0x10 + 8);
    psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar17 * -0x10 + 8);
  }
  secp256k1_ge_verify((secp256k1_ge *)a);
  secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,&secp256k1_const_beta);
  secp256k1_ge_verify((secp256k1_ge *)r);
  return;
}

Assistant:

static void secp256k1_modinv64_mul_62(secp256k1_modinv64_signed62 *r, const secp256k1_modinv64_signed62 *a, int alen, int64_t factor) {
    const uint64_t M62 = UINT64_MAX >> 2;
    secp256k1_int128 c, d;
    int i;
    secp256k1_i128_from_i64(&c, 0);
    for (i = 0; i < 4; ++i) {
        if (i < alen) secp256k1_i128_accum_mul(&c, a->v[i], factor);
        r->v[i] = secp256k1_i128_to_u64(&c) & M62; secp256k1_i128_rshift(&c, 62);
    }
    if (4 < alen) secp256k1_i128_accum_mul(&c, a->v[4], factor);
    secp256k1_i128_from_i64(&d, secp256k1_i128_to_i64(&c));
    VERIFY_CHECK(secp256k1_i128_eq_var(&c, &d));
    r->v[4] = secp256k1_i128_to_i64(&c);
}